

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledLineOrder.cpp
# Opt level: O1

void testTiledLineOrder(string *tempDir)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  long *plVar4;
  int in_ECX;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong uVar5;
  int in_R8D;
  uint uVar6;
  bool bVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing line orders for tiled files and buffered/unbuffered tile writes",0x47);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  uVar5 = (ulong)(uint)(int)cVar1;
  std::ostream::put('X');
  std::ostream::flush();
  bVar2 = IlmThread_3_2::supportsThreads();
  uVar6 = 0;
  do {
    cVar1 = IlmThread_3_2::supportsThreads();
    iVar3 = extraout_EDX;
    if (cVar1 != '\0') {
      Imf_3_2::setGlobalThreadCount(uVar6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
      iVar3 = Imf_3_2::globalThreadCount();
      plVar4 = (long *)std::ostream::operator<<(&std::cout,iVar3);
      cVar1 = std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      uVar5 = (ulong)(uint)(int)cVar1;
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      iVar3 = extraout_EDX_00;
    }
    anon_unknown.dwarf_311a71::writeCopyRead(tempDir,(int)uVar5,iVar3,in_ECX,in_R8D);
    bVar7 = uVar6 < 3;
    uVar6 = uVar6 + 1;
    in_ECX = CONCAT31((int3)((uint)in_ECX >> 8),bVar7);
  } while ((bVar2 & bVar7) != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void
testTiledLineOrder (const std::string& tempDir)
{
    try
    {
        cout << "Testing line orders for tiled files and "
                "buffered/unbuffered tile writes"
             << endl;

        const int W  = 171;
        const int H  = 259;
        const int XS = 55;
        const int YS = 55;

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            writeCopyRead (tempDir, W, H, XS, YS);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}